

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::should_force_emit_builtin_block(CompilerGLSL *this,StorageClass storage)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  StorageClass SVar5;
  ExecutionModel EVar6;
  SPIRVariable *var;
  SPIRType *pSVar7;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  uint32_t i;
  uint32_t uVar9;
  bool bVar10;
  LoopLock local_50;
  ParsedIR *local_48;
  TypedID<(spirv_cross::Types)0> *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  if (storage == StorageClassOutput) {
    local_48 = &(this->super_Compiler).ir;
    ParsedIR::create_loop_hard_lock(local_48);
    pTVar8 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_40 = pTVar8 + (this->super_Compiler).ir.ids_for_type[2].
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    bVar10 = false;
    while (pTVar8 != local_40) {
      local_38 = pTVar8;
      if (((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[pTVar8->id].type
           == TypeVariable) &&
         (var = ParsedIR::get<spirv_cross::SPIRVariable>(local_48,pTVar8->id), !bVar10)) {
        pSVar7 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
        bVar2 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                           DecorationBlock);
        SVar5 = var->storage;
        if (bVar2 && SVar5 == StorageClassOutput) {
          bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var);
          if (bVar3) {
            sVar1 = (pSVar7->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            for (uVar9 = 0; (uint32_t)sVar1 != uVar9; uVar9 = uVar9 + 1) {
              bVar2 = Compiler::has_member_decoration
                                (&this->super_Compiler,(TypeID)(pSVar7->super_IVariant).self.id,
                                 uVar9,DecorationBuiltIn);
              if (((bVar2) &&
                  (uVar4 = Compiler::get_member_decoration
                                     (&this->super_Compiler,(TypeID)(pSVar7->super_IVariant).self.id
                                      ,uVar9,DecorationBuiltIn), uVar4 < 5)) &&
                 ((uVar4 != 2 &&
                  (bVar2 = Compiler::has_member_decoration
                                     (&this->super_Compiler,(TypeID)(pSVar7->super_IVariant).self.id
                                      ,uVar9,DecorationOffset), bVar2)))) {
                bVar10 = true;
              }
            }
            goto LAB_0022fee2;
          }
          SVar5 = var->storage;
        }
        if ((((!bVar2 && SVar5 == StorageClassOutput) &&
             (bVar2 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar2)) &&
            (uVar9 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                                DecorationBuiltIn), uVar9 < 5)) &&
           ((uVar9 != 2 &&
            (bVar2 = Compiler::has_decoration
                               (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                DecorationOffset), bVar2)))) {
          bVar10 = true;
        }
      }
LAB_0022fee2:
      pTVar8 = local_38 + 1;
    }
    ParsedIR::LoopLock::~LoopLock(&local_50);
    EVar6 = Compiler::get_execution_model(&this->super_Compiler);
    if (((EVar6 == ExecutionModelTessellationControl) ||
        (EVar6 = Compiler::get_execution_model(&this->super_Compiler), bVar2 = bVar10,
        EVar6 == ExecutionModelMeshEXT)) &&
       (bVar2 = true,
       (this->super_Compiler).cull_distance_count == 0 &&
       (this->super_Compiler).clip_distance_count == 0)) {
      bVar2 = bVar10;
    }
    EVar6 = Compiler::get_execution_model(&this->super_Compiler);
    bVar2 = (bool)(EVar6 == ExecutionModelMeshEXT & (this->super_Compiler).position_invariant |
                  bVar2);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CompilerGLSL::should_force_emit_builtin_block(StorageClass storage)
{
	// If the builtin block uses XFB, we need to force explicit redeclaration of the builtin block.

	if (storage != StorageClassOutput)
		return false;
	bool should_force = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (should_force)
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (has_member_decoration(type.self, i, DecorationBuiltIn) &&
				    is_block_builtin(BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn))) &&
				    has_member_decoration(type.self, i, DecorationOffset))
				{
					should_force = true;
				}
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			if (is_block_builtin(BuiltIn(get_decoration(type.self, DecorationBuiltIn))) &&
			    has_decoration(var.self, DecorationOffset))
			{
				should_force = true;
			}
		}
	});

	// If we're declaring clip/cull planes with control points we need to force block declaration.
	if ((get_execution_model() == ExecutionModelTessellationControl ||
	     get_execution_model() == ExecutionModelMeshEXT) &&
	    (clip_distance_count || cull_distance_count))
	{
		should_force = true;
	}

	// Either glslang bug or oversight, but global invariant position does not work in mesh shaders.
	if (get_execution_model() == ExecutionModelMeshEXT && position_invariant)
		should_force = true;

	return should_force;
}